

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxDecoder.cpp
# Opt level: O2

int __thiscall FluxDecoder::next_bit(FluxDecoder *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->m_flux;
  while( true ) {
    iVar3 = this->m_clock;
    if (iVar3 / 2 <= iVar1) {
      iVar1 = iVar1 - iVar3;
      this->m_flux = iVar1;
      if (iVar1 < iVar3 / 2) {
        iVar4 = 1;
        if (this->m_clocked_zeros < 4) {
          iVar2 = this->m_pll_adjust * iVar1;
          iVar5 = this->m_goodbits + 1;
        }
        else {
          iVar2 = (this->m_clock_centre - iVar3) * this->m_pll_adjust;
          iVar5 = iVar4;
          if (0xff < this->m_goodbits) {
            this->m_sync_lost = true;
          }
        }
        iVar3 = iVar2 / 100 + iVar3;
        if (iVar3 < this->m_clock_min) {
          iVar3 = this->m_clock_min;
        }
        if (this->m_clock_max < iVar3) {
          iVar3 = this->m_clock_max;
        }
        this->m_clock = iVar3;
        this->m_flux = ((100 - opt.pllphase) * iVar1) / 100;
        this->m_goodbits = iVar5;
      }
      else {
        this->m_clocked_zeros = this->m_clocked_zeros + 1;
        this->m_goodbits = this->m_goodbits + 1;
        iVar4 = 0;
      }
      return iVar4;
    }
    iVar1 = next_flux(this);
    if (iVar1 == -1) break;
    if (this->m_flux_scale_percent != 100) {
      iVar1 = (this->m_flux_scale_percent * iVar1) / 100;
    }
    iVar1 = iVar1 + this->m_flux;
    this->m_flux = iVar1;
    this->m_clocked_zeros = 0;
  }
  return -1;
}

Assistant:

int FluxDecoder::next_bit()
{
    int new_flux;

    while (m_flux < m_clock / 2)
    {
        if ((new_flux = next_flux()) == -1)
            return -1;

        if (m_flux_scale_percent != 100)
            new_flux = new_flux * m_flux_scale_percent / 100;

        m_flux += new_flux;
        m_clocked_zeros = 0;
    }

    m_flux -= m_clock;

    if (m_flux >= m_clock / 2)
    {
        ++m_clocked_zeros;
        ++m_goodbits;
        return 0;
    }

    // PLL: Adjust clock frequency according to phase mismatch
    if (m_clocked_zeros <= 3)
    {
        // In sync: adjust base clock by percentage of phase mismatch
        m_clock += m_flux * m_pll_adjust / 100;
    }
    else
    {
        // Out of sync: adjust base clock towards centre
        m_clock += (m_clock_centre - m_clock) * m_pll_adjust / 100;

        // Require 256 good bits before reporting another loss of sync
        if (m_goodbits >= 256)
            m_sync_lost = true;

        m_goodbits = 0;
    }

    // Clamp the clock's adjustment range
    m_clock = std::min(std::max(m_clock_min, m_clock), m_clock_max);

    // Authentic PLL: Do not snap the timing window to each flux transition
    new_flux = m_flux * (100 - opt.pllphase) / 100;
    m_flux = new_flux;

    ++m_goodbits;
    return 1;
}